

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_expression.hpp
# Opt level: O0

const_iterator * __thiscall
boost::numeric::ublas::
vector_binary<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>
::find(vector_binary<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>
       *this,size_type i)

{
  bool bVar1;
  undefined1 uVar2;
  const_subiterator1_type *it1_00;
  unsigned_long *puVar3;
  int __c;
  int __c_00;
  char *__s;
  const_subiterator2_type *__s_00;
  const_iterator *in_RDI;
  const_subiterator2_type it2_end;
  const_subiterator2_type it2;
  const_subiterator1_type it1_end;
  const_subiterator1_type it1;
  derived_iterator_type *in_stack_ffffffffffffff08;
  const_subiterator1_type *in_stack_ffffffffffffff10;
  vector_reference<const_boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  *in_stack_ffffffffffffff18;
  const_subiterator1_type *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  const_iterator *in_stack_ffffffffffffff30;
  const_iterator *local_c8;
  const_iterator *in_stack_ffffffffffffff40;
  const_subiterator1_type *local_78;
  const_iterator *local_70;
  const_subiterator2_type local_68;
  const_iterator local_58 [2];
  char local_38 [16];
  const_iterator local_28;
  unsigned_long local_18;
  
  vector_reference<const_boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  ::find(in_stack_ffffffffffffff18,(size_type)in_stack_ffffffffffffff10);
  size((vector_binary<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>
        *)0x913f50);
  vector_reference<const_boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  ::find(in_stack_ffffffffffffff18,(size_type)in_stack_ffffffffffffff10);
  vector_reference<const_boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  ::find(in_stack_ffffffffffffff18,(size_type)in_stack_ffffffffffffff10);
  size((vector_binary<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>
        *)0x913fa6);
  vector_reference<const_boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  ::find(in_stack_ffffffffffffff18,(size_type)in_stack_ffffffffffffff10);
  __s = local_38;
  bVar1 = bidirectional_iterator_base<boost::numeric::ublas::sparse_bidirectional_iterator_tag,_boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::const_iterator,_double>
          ::operator!=((bidirectional_iterator_base<boost::numeric::ublas::sparse_bidirectional_iterator_tag,_boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::const_iterator,_double>
                        *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  if (bVar1) {
    local_c8 = (const_iterator *)
               compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
               ::const_iterator::index(&local_28,__s,__c);
    in_stack_ffffffffffffff40 = local_c8;
  }
  else {
    in_stack_ffffffffffffff30 =
         (const_iterator *)
         size((vector_binary<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>
               *)0x914015);
    local_c8 = in_stack_ffffffffffffff30;
  }
  local_70 = local_c8;
  __s_00 = &local_68;
  uVar2 = bidirectional_iterator_base<boost::numeric::ublas::sparse_bidirectional_iterator_tag,_boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::const_iterator,_double>
          ::operator!=((bidirectional_iterator_base<boost::numeric::ublas::sparse_bidirectional_iterator_tag,_boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::const_iterator,_double>
                        *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  if ((bool)uVar2) {
    it1_00 = (const_subiterator1_type *)
             compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
             ::const_iterator::index(local_58,(char *)__s_00,__c_00);
    in_stack_ffffffffffffff20 = it1_00;
  }
  else {
    in_stack_ffffffffffffff10 =
         (const_subiterator1_type *)
         size((vector_binary<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>
               *)0x914084);
    it1_00 = in_stack_ffffffffffffff10;
  }
  local_78 = it1_00;
  puVar3 = std::min<unsigned_long>((unsigned_long *)&local_70,(unsigned_long *)&local_78);
  local_18 = *puVar3;
  const_iterator::const_iterator
            (in_stack_ffffffffffffff30,(self_type *)CONCAT17(uVar2,in_stack_ffffffffffffff28),
             (size_type)in_stack_ffffffffffffff20,it1_00,in_stack_ffffffffffffff10,&local_68,
             (const_subiterator2_type *)in_stack_ffffffffffffff40);
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::const_iterator::~const_iterator((const_iterator *)0x914110);
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::const_iterator::~const_iterator((const_iterator *)0x91411d);
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::const_iterator::~const_iterator((const_iterator *)0x91412a);
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::const_iterator::~const_iterator((const_iterator *)0x914137);
  return in_RDI;
}

Assistant:

BOOST_UBLAS_INLINE
        const_iterator find (size_type i) const {
            const_subiterator1_type it1 (e1_.find (i));
            const_subiterator1_type it1_end (e1_.find (size ()));
            const_subiterator2_type it2 (e2_.find (i));
            const_subiterator2_type it2_end (e2_.find (size ()));
            i = (std::min) (it1 != it1_end ? it1.index () : size (),
                          it2 != it2_end ? it2.index () : size ());
#ifdef BOOST_UBLAS_USE_INDEXED_ITERATOR
            return const_iterator (*this, i);
#else
            return const_iterator (*this, i, it1, it1_end, it2, it2_end);
#endif
        }